

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O2

mat4_t * mat4_lookat(mat4_t *__return_storage_ptr__,vec3_t eye,vec3_t dest,vec3_t up)

{
  mat4_t a;
  mat4_t b;
  vec3_t vVar1;
  vec3_t vVar2;
  vec3_t vVar3;
  mat4_t m_1;
  mat4_t m;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 local_98;
  
  vVar1.y = dest.y - eye.y;
  vVar1.x = dest.x - eye.x;
  vVar1.z = dest.z - eye.z;
  vVar1 = vec3_normalize(vVar1);
  vVar2 = vec3_cross(vVar1,up);
  vVar2 = vec3_normalize(vVar2);
  vVar3 = vec3_cross(vVar2,vVar1);
  vVar3 = vec3_normalize(vVar3);
  local_98 = vVar1.x;
  local_e8 = vVar2.x;
  uStack_e4 = vVar2.y;
  b.m[3][3] = 1.0;
  b.m[3][2] = -eye.z;
  a._56_8_ = 0x3f80000000000000;
  a._0_56_ = ZEXT4456(CONCAT440(-vVar1.z,CONCAT832(CONCAT44(vVar3.z,vVar2.z),
                                                   CONCAT428(0,CONCAT424(-vVar1.y,CONCAT816(CONCAT44
                                                  (vVar3.y,uStack_e4),
                                                  CONCAT412(0,CONCAT48(-local_98,
                                                                       CONCAT44(vVar3.x,local_e8))))
                                                  )))));
  b._40_8_ = 0x3f800000;
  b._0_40_ = ZEXT2440(CONCAT816(0x3f80000000000000,ZEXT816(0x3f800000)));
  b._48_8_ = eye._0_8_ ^ 0x8000000080000000;
  mat4_mulm(a,b);
  return __return_storage_ptr__;
}

Assistant:

mat4_t
mat4_lookat(vec3_t eye, vec3_t dest, vec3_t up) {
    vec3_t	f	= vec3_normalize(vec3_sub(dest, eye));
    vec3_t	s	= vec3_normalize(vec3_cross(f, up));
    vec3_t	u	= vec3_normalize(vec3_cross(s, f));

    mat4_t	trans	= mat4_translation(vec3_neg(eye));

    mat4_t	m	= mat4(s.x, u.x, -f.x, 0.0f,
                   s.y, u.y, -f.y, 0.0f,
                   s.z, u.z, -f.z, 0.0f,
                   0.0f, 0.0f, 0.0f, 1.0f);
    return mat4_mulm(m, trans);
}